

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::java::anon_unknown_0::GenerateSetBitInternal
                   (string *__return_storage_ptr__,string *prefix,int bitIndex)

{
  pointer pcVar1;
  undefined8 uVar2;
  long *plVar3;
  string *psVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string mask;
  string varName;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  iVar7 = bitIndex + 0x1f;
  if (-1 < bitIndex) {
    iVar7 = bitIndex;
  }
  GetBitFieldName_abi_cxx11_(&local_68,(java *)(ulong)(uint)(iVar7 >> 5),bitIndex);
  plVar3 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_68,0,(char *)0x0,(ulong)(prefix->_M_dataplus)._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_38 = *plVar5;
    lStack_30 = plVar3[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar5;
    local_48 = (long *)*plVar3;
  }
  local_40 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  std::__cxx11::string::string
            ((string *)&local_68,*(char **)(bit_masks + (long)(bitIndex % 0x20) * 8),
             (allocator *)local_88);
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)local_88);
  psVar4 = (string *)
           std::__cxx11::string::_M_append((char *)local_88,(ulong)local_68._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  paVar6 = &psVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar6) {
    uVar2 = *(undefined8 *)((long)&psVar4->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar4->_M_string_length;
  (psVar4->_M_dataplus)._M_p = (pointer)paVar6;
  psVar4->_M_string_length = 0;
  (psVar4->field_2)._M_local_buf[0] = '\0';
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
    psVar4 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
    psVar4 = extraout_RAX_00;
  }
  if (local_48 != &local_38) {
    operator_delete(local_48);
    psVar4 = extraout_RAX_01;
  }
  return psVar4;
}

Assistant:

std::string GenerateSetBitInternal(const std::string& prefix, int bitIndex) {
  std::string varName = prefix + GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = varName + " |= " + mask;
  return result;
}